

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiheadattention_x86_avx512.cpp
# Opt level: O1

int __thiscall
ncnn::MultiHeadAttention_x86_avx512::forward
          (MultiHeadAttention_x86_avx512 *this,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *_opt)

{
  undefined8 *puVar1;
  int iVar2;
  int *piVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  size_t sVar6;
  int iVar7;
  Allocator *pAVar8;
  int iVar9;
  void *pvVar10;
  Allocator *pAVar11;
  undefined4 uVar12;
  long *plVar13;
  undefined4 uVar14;
  long *plVar15;
  ulong uVar16;
  int iVar17;
  int _w;
  int iVar18;
  uint uVar19;
  long lVar20;
  long lVar21;
  pointer pMVar22;
  void *pvVar23;
  int iVar24;
  pointer pMVar25;
  ulong uVar26;
  void *pvVar27;
  long lVar28;
  long lVar29;
  bool bVar30;
  Option opt1;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> qk_bottom_blobs;
  vector<int,_std::allocator<int>_> retqkvs;
  vector<int,_std::allocator<int>_> retqks;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> qkv_bottom_blobs;
  Option opt;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> qkv_top_blobs;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> qk_top_blobs;
  long local_388;
  long local_380;
  value_type local_378;
  long local_330;
  Mat local_328;
  long local_2e0;
  pointer local_2d8;
  MultiHeadAttention_x86_avx512 *local_2d0;
  Mat local_2c8;
  Mat local_278;
  void *local_228;
  undefined4 uStack_220;
  undefined4 uStack_21c;
  undefined4 local_218;
  undefined4 uStack_214;
  undefined4 local_210;
  long *local_208;
  undefined4 uStack_200;
  int iStack_1fc;
  undefined4 uStack_1f8;
  undefined4 uStack_1f4;
  undefined4 local_1f0;
  undefined8 local_1e8;
  void *local_1d8;
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  undefined4 local_1c8;
  undefined4 uStack_1c4;
  undefined4 local_1c0;
  long *local_1b8;
  undefined4 uStack_1b0;
  int iStack_1ac;
  undefined4 uStack_1a8;
  undefined4 uStack_1a4;
  undefined4 local_1a0;
  undefined8 local_198;
  Mat local_188;
  vector<int,_std::allocator<int>_> local_138;
  vector<int,_std::allocator<int>_> local_118;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_f8;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> local_f0;
  undefined1 local_d8 [72];
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> local_90;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> local_78;
  int iStack_60;
  bool bStack_5c;
  bool bStack_5b;
  bool bStack_5a;
  bool bStack_59;
  Allocator *pAStack_58;
  int iStack_50;
  bool bStack_4c;
  bool bStack_4b;
  bool bStack_4a;
  bool bStack_49;
  int iStack_48;
  bool bStack_44;
  bool bStack_43;
  bool bStack_42;
  bool bStack_41;
  bool bStack_40;
  bool bStack_3f;
  bool bStack_3e;
  bool bStack_3d;
  bool bStack_3c;
  bool bStack_3b;
  bool bStack_3a;
  bool bStack_39;
  
  pMVar25 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  lVar20 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_finish - (long)pMVar25;
  pMVar22 = pMVar25;
  if (lVar20 != 0x48) {
    lVar21 = 0;
    if ((this->super_MultiHeadAttention).attn_mask == 0) {
      lVar21 = 0x48;
    }
    if (lVar20 != 0x90) {
      lVar21 = 0x48;
    }
    pMVar22 = (pointer)((long)&pMVar25->data + lVar21);
  }
  local_2d8 = pMVar25;
  if ((lVar20 != 0x48) &&
     (iVar18 = (this->super_MultiHeadAttention).attn_mask, iVar18 == 0 || lVar20 != 0x90)) {
    local_2d8 = pMVar22;
    if (iVar18 == 0) {
      local_2d8 = pMVar25 + 2;
    }
    if (lVar20 != 0xd8) {
      local_2d8 = pMVar25 + 2;
    }
    if (lVar20 == 0x90) {
      local_2d8 = pMVar22;
    }
  }
  if ((this->super_MultiHeadAttention).attn_mask == 0) {
    local_188.cstep = 0;
    local_188.data = (void *)0x0;
    local_188.refcount._0_4_ = 0;
    local_188.refcount._4_4_ = 0;
    local_188.elemsize._0_4_ = 0;
    local_188.elemsize._4_4_ = 0;
    local_188.elempack = 0;
    local_188.allocator = (Allocator *)0x0;
    local_188.dims = 0;
    local_188.w = 0;
    local_188.h = 0;
    local_188.d = 0;
    local_188.c = 0;
  }
  else {
    piVar3 = *(int **)((long)pMVar25 + lVar20 + -0x40);
    puVar1 = (undefined8 *)((long)pMVar25 + lVar20 + -0x48);
    local_188.data = (void *)*puVar1;
    uVar4 = puVar1[1];
    local_188.refcount._0_4_ = (undefined4)uVar4;
    local_188.refcount._4_4_ = (undefined4)((ulong)uVar4 >> 0x20);
    uVar4 = *(undefined8 *)((long)pMVar25 + lVar20 + -0x38);
    local_188.elemsize._0_4_ = (undefined4)uVar4;
    local_188.elemsize._4_4_ = (undefined4)((ulong)uVar4 >> 0x20);
    local_188.elempack = *(int *)((long)pMVar25 + lVar20 + -0x30);
    local_188.allocator = *(Allocator **)((long)pMVar25 + lVar20 + -0x28);
    puVar1 = (undefined8 *)((long)pMVar25 + lVar20 + -0x20);
    uVar4 = *puVar1;
    uVar5 = puVar1[1];
    local_188.dims = (int)uVar4;
    local_188.w = (int)((ulong)uVar4 >> 0x20);
    local_188.h = (int)uVar5;
    local_188.d = (int)((ulong)uVar5 >> 0x20);
    local_188.c = *(int *)((long)pMVar25 + lVar20 + -0x10);
    local_188.cstep = *(ulong *)((long)pMVar25 + lVar20 + -8);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + 1;
      UNLOCK();
    }
  }
  local_d8[0] = _opt->lightmode;
  local_d8[1] = _opt->use_shader_pack8;
  local_d8[2] = _opt->use_subgroup_ops;
  local_d8[3] = _opt->use_reserved_0;
  local_d8._4_4_ = _opt->num_threads;
  local_d8._8_8_ = _opt->blob_allocator;
  local_d8._16_8_ = _opt->workspace_allocator;
  local_d8._24_4_ = _opt->openmp_blocktime;
  local_d8[0x1c] = _opt->use_winograd_convolution;
  local_d8[0x1d] = _opt->use_sgemm_convolution;
  local_d8[0x1e] = _opt->use_int8_inference;
  local_d8[0x1f] = _opt->use_vulkan_compute;
  local_d8._32_8_ = *(undefined8 *)&_opt->use_bf16_storage;
  local_d8._40_4_ = _opt->vulkan_device_index;
  local_d8[0x2c] = _opt->use_reserved_1;
  local_d8[0x2d] = _opt->use_image_storage;
  local_d8[0x2e] = _opt->use_tensor_storage;
  local_d8[0x2f] = _opt->use_reserved_2;
  local_d8._48_4_ = _opt->flush_denormals;
  local_d8[0x34] = _opt->use_local_pool_allocator;
  local_d8[0x35] = _opt->use_shader_local_memory;
  local_d8[0x36] = _opt->use_cooperative_matrix;
  local_d8[0x37] = _opt->use_winograd23_convolution;
  local_d8[0x38] = _opt->use_winograd43_convolution;
  local_d8[0x39] = _opt->use_winograd63_convolution;
  local_d8[0x3a] = _opt->use_a53_a55_optimized_kernel;
  local_d8[0x3b] = _opt->use_fp16_uniform;
  local_d8[0x3c] = _opt->use_int8_uniform;
  local_d8[0x3d] = _opt->use_reserved_9;
  local_d8[0x3e] = _opt->use_reserved_10;
  local_d8[0x3f] = _opt->use_reserved_11;
  if ((this->super_MultiHeadAttention).int8_scale_term != 0) {
    local_d8._32_8_ = local_d8._32_8_ & 0xffffffffffffff;
  }
  local_328.cstep = 0;
  local_328.data = (void *)0x0;
  local_328.refcount._0_4_ = 0;
  local_328.refcount._4_4_ = 0;
  local_328.elemsize._0_4_ = 0;
  local_328.elemsize._4_4_ = 0;
  local_328.elempack = 0;
  local_328.allocator = (Allocator *)0x0;
  local_328.dims = 0;
  local_328.w = 0;
  local_328.h = 0;
  local_328.d = 0;
  local_328.c = 0;
  local_f8 = top_blobs;
  if (((this->super_MultiHeadAttention).attn_mask == 0) || (local_188.elempack == 1)) {
    piVar3 = (int *)CONCAT44(local_188.refcount._4_4_,local_188.refcount._0_4_);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + 1;
      UNLOCK();
    }
    local_328.data = local_188.data;
    local_328.refcount._0_4_ = local_188.refcount._0_4_;
    local_328.refcount._4_4_ = local_188.refcount._4_4_;
    local_328.elemsize._0_4_ = (undefined4)local_188.elemsize;
    local_328.elemsize._4_4_ = local_188.elemsize._4_4_;
    local_328.elempack = local_188.elempack;
    local_328.allocator = local_188.allocator;
    local_328.dims = local_188.dims;
    local_328.w = local_188.w;
    local_328.h = local_188.h;
    local_328.d = local_188.d;
    local_328.c = local_188.c;
    local_328.cstep = local_188.cstep;
  }
  else {
    convert_packing(&local_188,&local_328,1,(Option *)local_d8);
    iVar18 = -100;
    if ((local_328.data == (void *)0x0) || ((long)local_328.c * local_328.cstep == 0))
    goto LAB_00566347;
  }
  iVar17 = (this->super_MultiHeadAttention).embed_dim / (this->super_MultiHeadAttention).num_heads;
  _w = pMVar25->elempack * pMVar25->h;
  iVar24 = pMVar22->elempack;
  iVar2 = pMVar22->h;
  local_198 = 0;
  local_1d8 = (void *)0x0;
  uStack_1d0 = 0;
  uStack_1cc = 0;
  local_1c8 = 0;
  uStack_1c4 = 0;
  local_1c0 = 0;
  local_1b8 = (long *)0x0;
  uStack_1b0 = 0;
  iStack_1ac = 0;
  uStack_1a8 = 0;
  uStack_1a4 = 0;
  local_1a0 = 0;
  iVar18 = (*this->q_gemm->_vptr_Layer[7])(this->q_gemm,pMVar25,&local_1d8,local_d8);
  if (iVar18 == 0) {
    local_1e8 = 0;
    local_228 = (void *)0x0;
    uStack_220 = 0;
    uStack_21c = 0;
    local_218 = 0;
    uStack_214 = 0;
    local_210 = 0;
    local_208 = (long *)0x0;
    uStack_200 = 0;
    iStack_1fc = 0;
    uStack_1f8 = 0;
    uStack_1f4 = 0;
    local_1f0 = 0;
    iVar18 = (*this->k_gemm->_vptr_Layer[7])(this->k_gemm,pMVar22,&local_228,local_d8);
    if (iVar18 == 0) {
      local_278.cstep = 0;
      local_278.data = (void *)0x0;
      local_278.refcount._0_4_ = 0;
      local_278.refcount._4_4_ = 0;
      local_278.elemsize._0_4_ = 0;
      local_278.elemsize._4_4_ = 0;
      local_278.elempack = 0;
      local_278.allocator = (Allocator *)0x0;
      local_278.dims = 0;
      local_278.w = 0;
      local_278.h = 0;
      local_278.d = 0;
      local_278.c = 0;
      Mat::create(&local_278,iVar24 * iVar2,(this->super_MultiHeadAttention).num_heads * _w,4,
                  (Allocator *)local_d8._8_8_);
      iVar18 = -100;
      if ((local_278.data != (void *)0x0) && ((long)local_278.c * local_278.cstep != 0)) {
        local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (int *)0x0;
        local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        std::vector<int,_std::allocator<int>_>::resize
                  (&local_118,(long)(this->super_MultiHeadAttention).num_heads);
        uVar19 = (this->super_MultiHeadAttention).num_heads;
        local_2d0 = this;
        if (0 < (int)uVar19) {
          lVar20 = (long)iVar17;
          lVar21 = 0;
          local_2e0 = 0;
          local_380 = 0;
          do {
            std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
                      ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&local_2c8,2,
                       (allocator_type *)&local_378);
            iVar18 = iStack_1ac;
            plVar15 = local_1b8;
            uVar14 = local_1c0;
            pvVar23 = local_2c8.data;
            lVar28 = (long)iStack_1ac;
            lVar29 = CONCAT44(uStack_1c4,local_1c8);
            pvVar27 = (void *)(lVar21 * lVar28 * lVar29 + (long)local_1d8);
            piVar3 = *(int **)((long)local_2c8.data + 8);
            local_330 = lVar21;
            if (piVar3 != (int *)0x0) {
              LOCK();
              *piVar3 = *piVar3 + -1;
              UNLOCK();
              if (*piVar3 == 0) {
                if (*(long **)((long)local_2c8.data + 0x20) == (long *)0x0) {
                  if (*local_2c8.data != (void *)0x0) {
                    free(*local_2c8.data);
                  }
                }
                else {
                  (**(code **)(**(long **)((long)local_2c8.data + 0x20) + 0x18))();
                }
              }
            }
            iVar24 = iStack_1fc;
            plVar13 = local_208;
            uVar12 = local_210;
            pvVar10 = local_2c8.data;
            *(long *)pvVar23 = 0;
            *(long *)((long)pvVar23 + 8) = 0;
            *(undefined8 *)((long)pvVar23 + 0xc) = 0;
            *(undefined8 *)((long)pvVar23 + 0x14) = 0;
            *(long *)((long)pvVar23 + 0x28) = 0;
            *(long *)((long)pvVar23 + 0x30) = 0;
            *(void **)pvVar23 = pvVar27;
            *(long *)((long)pvVar23 + 8) = 0;
            *(long *)((long)pvVar23 + 0x10) = lVar29;
            *(undefined4 *)((long)pvVar23 + 0x18) = uVar14;
            *(long **)((long)pvVar23 + 0x20) = plVar15;
            *(undefined4 *)((long)pvVar23 + 0x28) = 2;
            *(int *)((long)pvVar23 + 0x2c) = iVar18;
            *(int *)((long)pvVar23 + 0x30) = iVar17;
            *(undefined4 *)((long)pvVar23 + 0x34) = 1;
            *(undefined4 *)((long)pvVar23 + 0x38) = 1;
            *(long *)((long)pvVar23 + 0x40) = lVar28 * lVar20;
            lVar29 = (long)iStack_1fc;
            lVar21 = CONCAT44(uStack_214,local_218);
            pvVar23 = (void *)(local_330 * lVar29 * lVar21 + (long)local_228);
            piVar3 = *(int **)((long)local_2c8.data + 0x50);
            if (piVar3 != (int *)0x0) {
              LOCK();
              *piVar3 = *piVar3 + -1;
              UNLOCK();
              if (*piVar3 == 0) {
                if (*(long **)((long)local_2c8.data + 0x68) == (long *)0x0) {
                  if (*(void **)((long)local_2c8.data + 0x48) != (void *)0x0) {
                    free(*(void **)((long)local_2c8.data + 0x48));
                  }
                }
                else {
                  (**(code **)(**(long **)((long)local_2c8.data + 0x68) + 0x18))();
                }
              }
            }
            *(long *)((long)pvVar10 + 0x88) = 0;
            *(undefined8 *)((long)pvVar10 + 0x54) = 0;
            *(undefined8 *)((long)pvVar10 + 0x5c) = 0;
            *(long *)((long)pvVar10 + 0x48) = 0;
            *(long *)((long)pvVar10 + 0x50) = 0;
            *(long *)((long)pvVar10 + 0x70) = 0;
            *(long *)((long)pvVar10 + 0x78) = 0;
            *(void **)((long)pvVar10 + 0x48) = pvVar23;
            *(long *)((long)pvVar10 + 0x50) = 0;
            *(long *)((long)pvVar10 + 0x58) = lVar21;
            *(undefined4 *)((long)pvVar10 + 0x60) = uVar12;
            *(long **)((long)pvVar10 + 0x68) = plVar13;
            *(undefined4 *)((long)pvVar10 + 0x70) = 2;
            *(int *)((long)pvVar10 + 0x74) = iVar24;
            *(int *)((long)pvVar10 + 0x78) = iVar17;
            *(undefined4 *)((long)pvVar10 + 0x7c) = 1;
            *(undefined4 *)((long)pvVar10 + 0x80) = 1;
            *(long *)((long)pvVar10 + 0x88) = lVar29 * lVar20;
            if ((local_2d0->super_MultiHeadAttention).attn_mask != 0) {
              if (local_328.dims == 3) {
                local_378.cstep = CONCAT44(local_328.elemsize._4_4_,(undefined4)local_328.elemsize);
                local_378.data =
                     (void *)(local_328.cstep * local_380 * local_378.cstep + (long)local_328.data);
                local_378.refcount._0_4_ = 0;
                local_378.refcount._4_4_ = 0;
                local_378.d = 1;
                local_378.c = local_328.d;
                local_378.cstep =
                     ((long)local_328.h * (long)local_328.w * local_378.cstep + 0xf &
                     0xfffffffffffffff0) / local_378.cstep;
                local_378.dims = 2;
              }
              else {
                piVar3 = (int *)CONCAT44(local_328.refcount._4_4_,local_328.refcount._0_4_);
                local_378.data = local_328.data;
                local_378.refcount._0_4_ = local_328.refcount._0_4_;
                local_378.refcount._4_4_ = local_328.refcount._4_4_;
                local_378.dims = local_328.dims;
                local_378.d = local_328.d;
                local_378.c = local_328.c;
                local_378.cstep = local_328.cstep;
                if (piVar3 != (int *)0x0) {
                  LOCK();
                  *piVar3 = *piVar3 + 1;
                  UNLOCK();
                }
              }
              local_378.h = local_328.h;
              local_378.w = local_328.w;
              local_378.allocator = local_328.allocator;
              local_378.elempack = local_328.elempack;
              local_378.elemsize._4_4_ = local_328.elemsize._4_4_;
              local_378.elemsize._0_4_ = (undefined4)local_328.elemsize;
              std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::push_back
                        ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&local_2c8,&local_378);
              piVar3 = (int *)CONCAT44(local_378.refcount._4_4_,local_378.refcount._0_4_);
              if (piVar3 != (int *)0x0) {
                LOCK();
                *piVar3 = *piVar3 + -1;
                UNLOCK();
                if (*piVar3 == 0) {
                  if (local_378.allocator == (Allocator *)0x0) {
                    if (local_378.data != (void *)0x0) {
                      free(local_378.data);
                    }
                  }
                  else {
                    (*(local_378.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
              local_378.cstep = 0;
              local_378.data = (void *)0x0;
              local_378.refcount._0_4_ = 0;
              local_378.refcount._4_4_ = 0;
              local_378.elemsize._0_4_ = 0;
              local_378.elemsize._4_4_ = 0;
              local_378.elempack = 0;
              local_378.dims = 0;
              local_378.w = 0;
              local_378.h = 0;
              local_378.d = 0;
              local_378.c = 0;
            }
            std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
                      (&local_78,1,(allocator_type *)&local_378);
            pMVar22 = local_78.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                      super__Vector_impl_data._M_start;
            iVar24 = local_278.w;
            pAVar11 = local_278.allocator;
            iVar18 = local_278.elempack;
            lVar21 = (long)local_278.w;
            sVar6 = CONCAT44(local_278.elemsize._4_4_,(undefined4)local_278.elemsize);
            pvVar23 = (void *)(local_2e0 * lVar21 * sVar6 + (long)local_278.data);
            pMVar25 = (pointer)(ulong)(uint)local_278.elempack;
            piVar3 = (local_78.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                      super__Vector_impl_data._M_start)->refcount;
            if (piVar3 != (int *)0x0) {
              LOCK();
              *piVar3 = *piVar3 + -1;
              UNLOCK();
              if (*piVar3 == 0) {
                if ((local_78.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                     super__Vector_impl_data._M_start)->allocator == (Allocator *)0x0) {
                  if ((local_78.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                       super__Vector_impl_data._M_start)->data != (void *)0x0) {
                    free((local_78.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                          .super__Vector_impl_data._M_start)->data);
                  }
                }
                else {
                  (*(local_78.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                     super__Vector_impl_data._M_start)->allocator->_vptr_Allocator[3])();
                }
              }
            }
            this = local_2d0;
            pMVar22->data = (void *)0x0;
            pMVar22->refcount = (int *)0x0;
            *(undefined8 *)((long)&pMVar22->refcount + 4) = 0;
            *(undefined8 *)((long)&pMVar22->elemsize + 4) = 0;
            pMVar22->dims = 0;
            pMVar22->w = 0;
            pMVar22->h = 0;
            pMVar22->d = 0;
            pMVar22->data = pvVar23;
            pMVar22->refcount = (int *)0x0;
            pMVar22->elemsize = sVar6;
            pMVar22->elempack = iVar18;
            pMVar22->allocator = pAVar11;
            pMVar22->dims = 2;
            pMVar22->w = iVar24;
            pMVar22->h = _w;
            pMVar22->d = 1;
            pMVar22->c = 1;
            pMVar22->cstep = lVar21 * _w;
            local_378.refcount._0_4_ = (undefined4)local_d8._8_8_;
            local_378.refcount._4_4_ = SUB84(local_d8._8_8_,4);
            local_378.elemsize._0_4_ = (undefined4)local_d8._16_8_;
            local_378.elemsize._4_4_ = SUB84(local_d8._16_8_,4);
            local_378.elempack = (int)local_d8._24_8_;
            local_378._28_4_ = SUB84(local_d8._24_8_,4);
            local_378.allocator = (Allocator *)local_d8._32_8_;
            local_378.dims = (int)local_d8._40_8_;
            local_378.w = SUB84(local_d8._40_8_,4);
            local_378.h = (int)local_d8._48_8_;
            local_378.d = SUB84(local_d8._48_8_,4);
            local_378.c = (int)local_d8._56_8_;
            local_378._60_4_ = SUB84(local_d8._56_8_,4);
            local_378.data = (void *)CONCAT44(1,(int)local_d8._0_8_);
            iVar18 = (*local_2d0->qk_gemm->_vptr_Layer[6])
                               (local_2d0->qk_gemm,&local_2c8,&local_78,&local_378);
            local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[local_380] = iVar18;
            std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&local_78);
            std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector
                      ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&local_2c8);
            local_380 = local_380 + 1;
            uVar19 = (this->super_MultiHeadAttention).num_heads;
            local_2e0 = local_2e0 + _w;
            lVar21 = local_330 + lVar20;
          } while (local_380 < (int)uVar19);
        }
        iVar24 = (int)pMVar25;
        bVar30 = 0 < (int)uVar19;
        if ((0 < (int)uVar19) &&
           (iVar24 = *local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start, iVar24 == 0)) {
          uVar16 = 1;
          do {
            uVar26 = uVar16;
            if (uVar19 == uVar26) break;
            iVar24 = local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar26];
            uVar16 = uVar26 + 1;
          } while (iVar24 == 0);
          bVar30 = uVar26 < uVar19;
        }
        iVar18 = iVar24;
        if (!bVar30) {
          piVar3 = (int *)CONCAT44(uStack_1cc,uStack_1d0);
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + -1;
            UNLOCK();
            if (*piVar3 == 0) {
              if (local_1b8 == (long *)0x0) {
                if (local_1d8 != (void *)0x0) {
                  free(local_1d8);
                }
              }
              else {
                (**(code **)(*local_1b8 + 0x18))();
              }
            }
          }
          local_198 = 0;
          local_1d8 = (void *)0x0;
          uStack_1d0 = 0;
          uStack_1cc = 0;
          local_1c8 = 0;
          uStack_1c4 = 0;
          local_1c0 = 0;
          uStack_1b0 = 0;
          iStack_1ac = 0;
          uStack_1a8 = 0;
          uStack_1a4 = 0;
          local_1a0 = 0;
          piVar3 = (int *)CONCAT44(uStack_21c,uStack_220);
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + -1;
            UNLOCK();
            if (*piVar3 == 0) {
              if (local_208 == (long *)0x0) {
                if (local_228 != (void *)0x0) {
                  free(local_228);
                }
              }
              else {
                (**(code **)(*local_208 + 0x18))();
              }
            }
          }
          local_1e8 = 0;
          local_228 = (void *)0x0;
          uStack_220 = 0;
          uStack_21c = 0;
          local_218 = 0;
          uStack_214 = 0;
          local_210 = 0;
          uStack_200 = 0;
          iStack_1fc = 0;
          uStack_1f8 = 0;
          uStack_1f4 = 0;
          local_1f0 = 0;
          iVar18 = (*this->qk_softmax->_vptr_Layer[9])(this->qk_softmax,&local_278,local_d8);
          if (iVar18 == 0) {
            local_378.cstep = 0;
            local_378.data = (void *)0x0;
            local_378.refcount._0_4_ = 0;
            local_378.refcount._4_4_ = 0;
            local_378.elemsize._0_4_ = 0;
            local_378.elemsize._4_4_ = 0;
            local_378.elempack = 0;
            local_378.allocator = (Allocator *)0x0;
            local_378.dims = 0;
            local_378.w = 0;
            local_378.h = 0;
            local_378.d = 0;
            local_378.c = 0;
            iVar18 = (*this->v_gemm->_vptr_Layer[7])(this->v_gemm,local_2d8,&local_378,local_d8);
            if (iVar18 == 0) {
              local_2c8.cstep = 0;
              local_2c8.data = (void *)0x0;
              local_2c8.refcount._0_4_ = 0;
              local_2c8.refcount._4_4_ = 0;
              local_2c8.elemsize._0_4_ = 0;
              local_2c8.elemsize._4_4_ = 0;
              local_2c8.elempack = 0;
              local_2c8.allocator = (Allocator *)0x0;
              local_2c8.dims = 0;
              local_2c8.w = 0;
              local_2c8.h = 0;
              local_2c8.d = 0;
              local_2c8.c = 0;
              Mat::create(&local_2c8,_w,(this->super_MultiHeadAttention).num_heads * iVar17,4,
                          (Allocator *)local_d8._8_8_);
              iVar18 = -100;
              if ((local_2c8.data != (void *)0x0) && ((long)local_2c8.c * local_2c8.cstep != 0)) {
                local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start = (int *)0x0;
                local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0x0;
                local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                std::vector<int,_std::allocator<int>_>::resize
                          (&local_138,(long)(this->super_MultiHeadAttention).num_heads);
                uVar19 = (this->super_MultiHeadAttention).num_heads;
                if (0 < (int)uVar19) {
                  local_330 = (long)iVar17;
                  pMVar25 = (pointer)0x0;
                  local_388 = 0;
                  lVar20 = 0;
                  do {
                    local_2e0 = lVar20;
                    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
                              (&local_f0,2,(allocator_type *)&local_78);
                    pMVar22 = local_f0.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                              _M_impl.super__Vector_impl_data._M_start;
                    iVar2 = local_278.w;
                    pAVar11 = local_278.allocator;
                    iVar18 = local_278.elempack;
                    lVar20 = (long)local_278.w;
                    sVar6 = CONCAT44(local_278.elemsize._4_4_,(undefined4)local_278.elemsize);
                    pvVar23 = (void *)((long)pMVar25 * lVar20 * sVar6 + (long)local_278.data);
                    piVar3 = (local_f0.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                              _M_impl.super__Vector_impl_data._M_start)->refcount;
                    local_2d8 = pMVar25;
                    if (piVar3 != (int *)0x0) {
                      LOCK();
                      *piVar3 = *piVar3 + -1;
                      UNLOCK();
                      if (*piVar3 == 0) {
                        if ((local_f0.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                             _M_impl.super__Vector_impl_data._M_start)->allocator ==
                            (Allocator *)0x0) {
                          if ((local_f0.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                               _M_impl.super__Vector_impl_data._M_start)->data != (void *)0x0) {
                            free((local_f0.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->data);
                          }
                        }
                        else {
                          (*(local_f0.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                             _M_impl.super__Vector_impl_data._M_start)->allocator->_vptr_Allocator
                            [3])();
                        }
                      }
                    }
                    pMVar25 = local_f0.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                              _M_impl.super__Vector_impl_data._M_start;
                    iVar9 = local_378.w;
                    pAVar8 = local_378.allocator;
                    iVar7 = local_378.elempack;
                    pMVar22->data = (void *)0x0;
                    pMVar22->refcount = (int *)0x0;
                    *(undefined8 *)((long)&pMVar22->refcount + 4) = 0;
                    *(undefined8 *)((long)&pMVar22->elemsize + 4) = 0;
                    pMVar22->dims = 0;
                    pMVar22->w = 0;
                    pMVar22->h = 0;
                    pMVar22->d = 0;
                    pMVar22->data = pvVar23;
                    pMVar22->refcount = (int *)0x0;
                    pMVar22->elemsize = sVar6;
                    pMVar22->elempack = iVar18;
                    pMVar22->allocator = pAVar11;
                    pMVar22->dims = 2;
                    pMVar22->w = iVar2;
                    pMVar22->h = _w;
                    pMVar22->d = 1;
                    pMVar22->c = 1;
                    pMVar22->cstep = lVar20 * _w;
                    lVar20 = (long)local_378.w;
                    sVar6 = CONCAT44(local_378.elemsize._4_4_,(undefined4)local_378.elemsize);
                    pvVar23 = (void *)(local_388 * lVar20 * sVar6 + (long)local_378.data);
                    piVar3 = local_f0.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                             _M_impl.super__Vector_impl_data._M_start[1].refcount;
                    if (piVar3 != (int *)0x0) {
                      LOCK();
                      *piVar3 = *piVar3 + -1;
                      UNLOCK();
                      if (*piVar3 == 0) {
                        if (local_f0.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                            _M_impl.super__Vector_impl_data._M_start[1].allocator ==
                            (Allocator *)0x0) {
                          if (local_f0.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                              _M_impl.super__Vector_impl_data._M_start[1].data != (void *)0x0) {
                            free(local_f0.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                 _M_impl.super__Vector_impl_data._M_start[1].data);
                          }
                        }
                        else {
                          (*(local_f0.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                             _M_impl.super__Vector_impl_data._M_start[1].allocator)->_vptr_Allocator
                            [3])();
                        }
                      }
                    }
                    pMVar25[1].cstep = 0;
                    *(undefined8 *)((long)&pMVar25[1].refcount + 4) = 0;
                    *(undefined8 *)((long)&pMVar25[1].elemsize + 4) = 0;
                    pMVar25[1].data = (void *)0x0;
                    pMVar25[1].refcount = (int *)0x0;
                    pMVar25[1].dims = 0;
                    pMVar25[1].w = 0;
                    pMVar25[1].h = 0;
                    pMVar25[1].d = 0;
                    pMVar25[1].data = pvVar23;
                    pMVar25[1].refcount = (int *)0x0;
                    pMVar25[1].elemsize = sVar6;
                    pMVar25[1].elempack = iVar7;
                    pMVar25[1].allocator = pAVar8;
                    pMVar25[1].dims = 2;
                    pMVar25[1].w = iVar9;
                    pMVar25[1].h = iVar17;
                    pMVar25[1].d = 1;
                    pMVar25[1].c = 1;
                    pMVar25[1].cstep = lVar20 * local_330;
                    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
                              (&local_90,1,(allocator_type *)&local_78);
                    pMVar25 = local_90.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                              _M_impl.super__Vector_impl_data._M_start;
                    iVar2 = local_2c8.w;
                    pAVar11 = local_2c8.allocator;
                    iVar18 = local_2c8.elempack;
                    lVar20 = (long)local_2c8.w;
                    sVar6 = CONCAT44(local_2c8.elemsize._4_4_,(undefined4)local_2c8.elemsize);
                    pvVar23 = (void *)((long)local_2c8.data + local_388 * lVar20 * sVar6);
                    piVar3 = (local_90.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                              _M_impl.super__Vector_impl_data._M_start)->refcount;
                    if (piVar3 != (int *)0x0) {
                      LOCK();
                      *piVar3 = *piVar3 + -1;
                      UNLOCK();
                      if (*piVar3 == 0) {
                        if ((local_90.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                             _M_impl.super__Vector_impl_data._M_start)->allocator ==
                            (Allocator *)0x0) {
                          if ((local_90.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                               _M_impl.super__Vector_impl_data._M_start)->data != (void *)0x0) {
                            free((local_90.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->data);
                          }
                        }
                        else {
                          (*(local_90.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                             _M_impl.super__Vector_impl_data._M_start)->allocator->_vptr_Allocator
                            [3])();
                        }
                      }
                    }
                    this = local_2d0;
                    lVar21 = local_330;
                    pMVar25->data = (void *)0x0;
                    pMVar25->refcount = (int *)0x0;
                    *(undefined8 *)((long)&pMVar25->refcount + 4) = 0;
                    *(undefined8 *)((long)&pMVar25->elemsize + 4) = 0;
                    pMVar25->dims = 0;
                    pMVar25->w = 0;
                    pMVar25->h = 0;
                    pMVar25->d = 0;
                    pMVar25->data = pvVar23;
                    pMVar25->refcount = (int *)0x0;
                    pMVar25->elemsize = sVar6;
                    pMVar25->elempack = iVar18;
                    pMVar25->allocator = pAVar11;
                    pMVar25->dims = 2;
                    pMVar25->w = iVar2;
                    pMVar25->h = iVar17;
                    pMVar25->d = 1;
                    pMVar25->c = 1;
                    pMVar25->cstep = lVar20 * local_330;
                    local_78.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                    super__Vector_impl_data._M_finish = (pointer)local_d8._8_8_;
                    local_78.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage = (pointer)local_d8._16_8_;
                    iStack_60 = local_d8._24_4_;
                    bStack_5c = (bool)local_d8[0x1c];
                    bStack_5b = (bool)local_d8[0x1d];
                    bStack_5a = (bool)local_d8[0x1e];
                    bStack_59 = (bool)local_d8[0x1f];
                    pAStack_58 = (Allocator *)local_d8._32_8_;
                    iStack_50 = local_d8._40_4_;
                    bStack_4c = (bool)local_d8[0x2c];
                    bStack_4b = (bool)local_d8[0x2d];
                    bStack_4a = (bool)local_d8[0x2e];
                    bStack_49 = (bool)local_d8[0x2f];
                    iStack_48 = local_d8._48_4_;
                    bStack_44 = (bool)local_d8[0x34];
                    bStack_43 = (bool)local_d8[0x35];
                    bStack_42 = (bool)local_d8[0x36];
                    bStack_41 = (bool)local_d8[0x37];
                    bStack_40 = (bool)local_d8[0x38];
                    bStack_3f = (bool)local_d8[0x39];
                    bStack_3e = (bool)local_d8[0x3a];
                    bStack_3d = (bool)local_d8[0x3b];
                    bStack_3c = (bool)local_d8[0x3c];
                    bStack_3b = (bool)local_d8[0x3d];
                    bStack_3a = (bool)local_d8[0x3e];
                    bStack_39 = (bool)local_d8[0x3f];
                    local_78.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                    super__Vector_impl_data._M_start = (pointer)CONCAT44(1,(int)local_d8._0_8_);
                    iVar18 = (*local_2d0->qkv_gemm->_vptr_Layer[6])
                                       (local_2d0->qkv_gemm,&local_f0,&local_90,&local_78);
                    lVar20 = local_2e0;
                    local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[local_2e0] = iVar18;
                    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&local_90);
                    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&local_f0);
                    lVar20 = lVar20 + 1;
                    uVar19 = (this->super_MultiHeadAttention).num_heads;
                    local_388 = local_388 + lVar21;
                    pMVar25 = (pointer)((long)&local_2d8->data + (long)_w);
                  } while (lVar20 < (int)uVar19);
                }
                bVar30 = 0 < (int)uVar19;
                iVar18 = iVar24;
                if ((0 < (int)uVar19) &&
                   (iVar18 = *local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start,
                   *local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start == 0)) {
                  uVar16 = 1;
                  do {
                    uVar26 = uVar16;
                    iVar18 = iVar24;
                    if (uVar19 == uVar26) break;
                    iVar18 = local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[uVar26];
                    uVar16 = uVar26 + 1;
                  } while (iVar18 == 0);
                  bVar30 = uVar26 < uVar19;
                }
                if (!bVar30) {
                  piVar3 = (int *)CONCAT44(local_378.refcount._4_4_,local_378.refcount._0_4_);
                  if (piVar3 != (int *)0x0) {
                    LOCK();
                    *piVar3 = *piVar3 + -1;
                    UNLOCK();
                    if (*piVar3 == 0) {
                      if (local_378.allocator == (Allocator *)0x0) {
                        if (local_378.data != (void *)0x0) {
                          free(local_378.data);
                        }
                      }
                      else {
                        (*(local_378.allocator)->_vptr_Allocator[3])();
                      }
                    }
                  }
                  local_378.cstep = 0;
                  local_378.data = (void *)0x0;
                  local_378.refcount._0_4_ = 0;
                  local_378.refcount._4_4_ = 0;
                  local_378.elemsize._0_4_ = 0;
                  local_378.elemsize._4_4_ = 0;
                  local_378.elempack = 0;
                  local_378.dims = 0;
                  local_378.w = 0;
                  local_378.h = 0;
                  local_378.d = 0;
                  local_378.c = 0;
                  iVar18 = (*this->o_gemm->_vptr_Layer[7])
                                     (this->o_gemm,&local_2c8,
                                      (local_f8->
                                      super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                      _M_impl.super__Vector_impl_data._M_start,local_d8);
                }
                if (local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start != (int *)0x0) {
                  operator_delete(local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start,
                                  (long)local_138.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_138.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start);
                }
              }
              piVar3 = (int *)CONCAT44(local_2c8.refcount._4_4_,local_2c8.refcount._0_4_);
              if (piVar3 != (int *)0x0) {
                LOCK();
                *piVar3 = *piVar3 + -1;
                UNLOCK();
                if (*piVar3 == 0) {
                  if (local_2c8.allocator == (Allocator *)0x0) {
                    if (local_2c8.data != (void *)0x0) {
                      free(local_2c8.data);
                    }
                  }
                  else {
                    (*(local_2c8.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
              local_2c8.cstep = 0;
              local_2c8.data = (long *)0x0;
              local_2c8.refcount._0_4_ = 0;
              local_2c8.refcount._4_4_ = 0;
              local_2c8.elemsize._0_4_ = 0;
              local_2c8.elemsize._4_4_ = 0;
              local_2c8.elempack = 0;
              local_2c8.dims = 0;
              local_2c8.w = 0;
              local_2c8.h = 0;
              local_2c8.d = 0;
              local_2c8.c = 0;
            }
            piVar3 = (int *)CONCAT44(local_378.refcount._4_4_,local_378.refcount._0_4_);
            if (piVar3 != (int *)0x0) {
              LOCK();
              *piVar3 = *piVar3 + -1;
              UNLOCK();
              if (*piVar3 == 0) {
                if (local_378.allocator == (Allocator *)0x0) {
                  if (local_378.data != (void *)0x0) {
                    free(local_378.data);
                  }
                }
                else {
                  (*(local_378.allocator)->_vptr_Allocator[3])();
                }
              }
            }
            local_378.cstep = 0;
            local_378.data = (void *)0x0;
            local_378.refcount._0_4_ = 0;
            local_378.refcount._4_4_ = 0;
            local_378.elemsize._0_4_ = 0;
            local_378.elemsize._4_4_ = 0;
            local_378.elempack = 0;
            local_378.dims = 0;
            local_378.w = 0;
            local_378.h = 0;
            local_378.d = 0;
            local_378.c = 0;
          }
        }
        if (local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (int *)0x0) {
          operator_delete(local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
      }
      piVar3 = (int *)CONCAT44(local_278.refcount._4_4_,local_278.refcount._0_4_);
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          if (local_278.allocator == (Allocator *)0x0) {
            if (local_278.data != (void *)0x0) {
              free(local_278.data);
            }
          }
          else {
            (*(local_278.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_278.cstep = 0;
      local_278.data = (void *)0x0;
      local_278.refcount._0_4_ = 0;
      local_278.refcount._4_4_ = 0;
      local_278.elemsize._0_4_ = 0;
      local_278.elemsize._4_4_ = 0;
      local_278.elempack = 0;
      local_278.dims = 0;
      local_278.w = 0;
      local_278.h = 0;
      local_278.d = 0;
      local_278.c = 0;
    }
    piVar3 = (int *)CONCAT44(uStack_21c,uStack_220);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        if (local_208 == (long *)0x0) {
          if (local_228 != (void *)0x0) {
            free(local_228);
          }
        }
        else {
          (**(code **)(*local_208 + 0x18))();
        }
      }
    }
    local_1e8 = 0;
    local_228 = (void *)0x0;
    uStack_220 = 0;
    uStack_21c = 0;
    local_218 = 0;
    uStack_214 = 0;
    local_210 = 0;
    uStack_200 = 0;
    iStack_1fc = 0;
    uStack_1f8 = 0;
    uStack_1f4 = 0;
    local_1f0 = 0;
  }
  piVar3 = (int *)CONCAT44(uStack_1cc,uStack_1d0);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      if (local_1b8 == (long *)0x0) {
        if (local_1d8 != (void *)0x0) {
          free(local_1d8);
        }
      }
      else {
        (**(code **)(*local_1b8 + 0x18))();
      }
    }
  }
  local_198 = 0;
  local_1d8 = (void *)0x0;
  uStack_1d0 = 0;
  uStack_1cc = 0;
  local_1c8 = 0;
  uStack_1c4 = 0;
  local_1c0 = 0;
  uStack_1b0 = 0;
  iStack_1ac = 0;
  uStack_1a8 = 0;
  uStack_1a4 = 0;
  local_1a0 = 0;
LAB_00566347:
  piVar3 = (int *)CONCAT44(local_328.refcount._4_4_,local_328.refcount._0_4_);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      if (local_328.allocator == (Allocator *)0x0) {
        if (local_328.data != (void *)0x0) {
          free(local_328.data);
        }
      }
      else {
        (*(local_328.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_328.cstep = 0;
  local_328.data = (void *)0x0;
  local_328.refcount._0_4_ = 0;
  local_328.refcount._4_4_ = 0;
  local_328.elemsize._0_4_ = 0;
  local_328.elemsize._4_4_ = 0;
  local_328.elempack = 0;
  local_328.dims = 0;
  local_328.w = 0;
  local_328.h = 0;
  local_328.d = 0;
  local_328.c = 0;
  piVar3 = (int *)CONCAT44(local_188.refcount._4_4_,local_188.refcount._0_4_);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      if (local_188.allocator == (Allocator *)0x0) {
        if (local_188.data != (void *)0x0) {
          free(local_188.data);
        }
      }
      else {
        (*(local_188.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar18;
}

Assistant:

int MultiHeadAttention_x86_avx512::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& _opt) const
{
    const Mat& q_blob = bottom_blobs[0];
    const Mat& k_blob = (bottom_blobs.size() == 1 || (bottom_blobs.size() == 2 && attn_mask)) ? q_blob : bottom_blobs[1];
    const Mat& v_blob = (bottom_blobs.size() == 1 || (bottom_blobs.size() == 2 && attn_mask)) ? q_blob : (bottom_blobs.size() == 2 || (bottom_blobs.size() == 3 && attn_mask)) ? k_blob : bottom_blobs[2];
    const Mat& attn_mask_blob = attn_mask ? bottom_blobs[bottom_blobs.size() - 1] : Mat();

    Option opt = _opt;
    if (int8_scale_term)
    {
        opt.use_packing_layout = false; // TODO enable packing
    }

    Mat attn_mask_blob_unpacked;
    if (attn_mask && attn_mask_blob.elempack != 1)
    {
        convert_packing(attn_mask_blob, attn_mask_blob_unpacked, 1, opt);
        if (attn_mask_blob_unpacked.empty())
            return -100;
    }
    else
    {
        attn_mask_blob_unpacked = attn_mask_blob;
    }

    const int embed_dim_per_head = embed_dim / num_heads;
    const int src_seqlen = q_blob.h * q_blob.elempack;
    const int dst_seqlen = k_blob.h * k_blob.elempack;

    Mat q_affine;
    int retq = q_gemm->forward(q_blob, q_affine, opt);
    if (retq != 0)
        return retq;

    Mat k_affine;
    int retk = k_gemm->forward(k_blob, k_affine, opt);
    if (retk != 0)
        return retk;

    Mat qk_cross(dst_seqlen, src_seqlen * num_heads, 4u, opt.blob_allocator);
    if (qk_cross.empty())
        return -100;

    std::vector<int> retqks;
    retqks.resize(num_heads);
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int i = 0; i < num_heads; i++)
    {
        std::vector<Mat> qk_bottom_blobs(2);
        qk_bottom_blobs[0] = q_affine.row_range(i * embed_dim_per_head, embed_dim_per_head);
        qk_bottom_blobs[1] = k_affine.row_range(i * embed_dim_per_head, embed_dim_per_head);
        if (attn_mask)
        {
            const Mat& maskm = attn_mask_blob_unpacked.dims == 3 ? attn_mask_blob_unpacked.channel(i) : attn_mask_blob_unpacked;
            qk_bottom_blobs.push_back(maskm);
        }
        std::vector<Mat> qk_top_blobs(1);
        qk_top_blobs[0] = qk_cross.row_range(i * src_seqlen, src_seqlen);
        Option opt1 = opt;
        opt1.num_threads = 1;
        retqks[i] = qk_gemm->forward(qk_bottom_blobs, qk_top_blobs, opt1);
    }
    for (int i = 0; i < num_heads; i++)
    {
        if (retqks[i] != 0)
            return retqks[i];
    }

    q_affine.release();
    k_affine.release();

    int retqk = qk_softmax->forward_inplace(qk_cross, opt);
    if (retqk != 0)
        return retqk;

    Mat v_affine;
    int retv = v_gemm->forward(v_blob, v_affine, opt);
    if (retv != 0)
        return retv;

    Mat qkv_cross(src_seqlen, embed_dim_per_head * num_heads, 4u, opt.blob_allocator);
    if (qkv_cross.empty())
        return -100;

    std::vector<int> retqkvs;
    retqkvs.resize(num_heads);
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int i = 0; i < num_heads; i++)
    {
        std::vector<Mat> qkv_bottom_blobs(2);
        qkv_bottom_blobs[0] = qk_cross.row_range(i * src_seqlen, src_seqlen);
        qkv_bottom_blobs[1] = v_affine.row_range(i * embed_dim_per_head, embed_dim_per_head);
        std::vector<Mat> qkv_top_blobs(1);
        qkv_top_blobs[0] = qkv_cross.row_range(i * embed_dim_per_head, embed_dim_per_head);
        Option opt1 = opt;
        opt1.num_threads = 1;
        retqkvs[i] = qkv_gemm->forward(qkv_bottom_blobs, qkv_top_blobs, opt1);
    }
    for (int i = 0; i < num_heads; i++)
    {
        if (retqkvs[i] != 0)
            return retqkvs[i];
    }

    v_affine.release();

    int reto = o_gemm->forward(qkv_cross, top_blobs[0], opt);
    if (reto != 0)
        return reto;

    return 0;
}